

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChVisualMaterial.h
# Opt level: O3

void __thiscall chrono::ChVisualMaterial::~ChVisualMaterial(ChVisualMaterial *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  pcVar1 = (this->opacity_texture).m_filename._M_dataplus._M_p;
  paVar2 = &(this->opacity_texture).m_filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->roughness_texture).m_filename._M_dataplus._M_p;
  paVar2 = &(this->roughness_texture).m_filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->metallic_texture).m_filename._M_dataplus._M_p;
  paVar2 = &(this->metallic_texture).m_filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->normal_texture).m_filename._M_dataplus._M_p;
  paVar2 = &(this->normal_texture).m_filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->ks_texture).m_filename._M_dataplus._M_p;
  paVar2 = &(this->ks_texture).m_filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->kd_texture).m_filename._M_dataplus._M_p;
  paVar2 = &(this->kd_texture).m_filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

class ChApi ChVisualMaterial {
  public:
    ChVisualMaterial();

    // Setting functions
    void SetAmbientColor(const ChColor& rgb);
    void SetDiffuseColor(const ChColor& rgb);
    void SetSpecularColor(const ChColor& rgb);
    void SetEmissiveColor(const ChColor& rgb);

    void SetSpecularExponent(float exponent);
    void SetOpacity(float o);
    void SetIllumination(int i);

    void SetKdTexture(const std::string& filename, float scale_x = 1, float scale_y = 1);
    void SetKsTexture(const std::string& filename, float scale_x = 1, float scale_y = 1);
    void SetNormalMapTexture(const std::string& filename, float scale_x = 1, float scale_y = 1);
    void SetMetallicTexture(const std::string& filename, float scale_x = 1, float scale_y = 1);
    void SetRoughnessTexture(const std::string& filename, float scale_x = 1, float scale_y = 1);
    void SetOpacityTexture(const std::string& filename, float scale_x = 1, float scale_y = 1);

    void SetFresnelExp(float exp);
    void SetFresnelMax(float max);
    void SetFresnelMin(float min);
    void SetRoughness(float r);
    void SetMetallic(float m);
    void SetUseSpecularWorkflow(bool s) { use_specular_workflow = s; }

    void SetClassID(unsigned short int id) { class_id = id; }
    void SetInstanceID(unsigned short int id) { instance_id = id; }

    // accessor functions
    const ChColor& GetAmbientColor() const { return Ka; }
    const ChColor& GetDiffuseColor() const { return Kd; }
    const ChColor& GetSpecularColor() const { return Ks; }
    const ChColor& GetEmissiveColor() const { return Ke; }
    float GetSpecularExponent() const { return Ns; }
    float GetOpacity() const { return d; }
    int GetIllumination() const { return illum; }

    const std::string& GetKdTexture() const { return kd_texture.GetFilename(); }
    const std::string& GetKsTexture() const { return ks_texture.GetFilename(); }
    const std::string& GetNormalMapTexture() const { return normal_texture.GetFilename(); }
    const std::string& GetMetallicTexture() const { return metallic_texture.GetFilename(); }
    const std::string& GetRoughnessTexture() const { return roughness_texture.GetFilename(); }
    const std::string& GetOpacityTexture() const { return opacity_texture.GetFilename(); }

    const ChVector2<float>& GetKdTextureScale() const { return kd_texture.GetScale(); }
    const ChVector2<float>& GetKsTextureScale() const { return ks_texture.GetScale(); }
    const ChVector2<float>& GetNormalMapTextureScale() const { return normal_texture.GetScale(); }
    const ChVector2<float>& GetMetallicTextureScale() const { return metallic_texture.GetScale(); }
    const ChVector2<float>& GetRoughnessTextureScale() const { return roughness_texture.GetScale(); }
    const ChVector2<float>& GetOpacityTextureScale() const { return opacity_texture.GetScale(); }

    float GetFresnelExp() const { return fresnel_exp; }
    float GetFresnelMax() const { return fresnel_max; }
    float GetFresnelMin() const { return fresnel_min; }
    float GetRoughness() const { return roughness; }
    float GetMetallic() const { return metallic; }
    bool GetUseSpecularWorkflow() const { return use_specular_workflow; }
    unsigned short int GetClassID() const { return class_id; }
    unsigned short int GetInstanceID() const { return instance_id; }

    static std::shared_ptr<ChVisualMaterial> Default();

  private:
    ChColor Ka;  ///< ambient color
    ChColor Kd;  ///< diffuse color
    ChColor Ks;  ///< specular color
    ChColor Ke;  ///< emissive color

    float fresnel_max;
    float fresnel_min;
    float fresnel_exp;
    float Ns;  ///< specular exponent
    float d;   ///< opacity

    int illum;  ///< illumination model (see http://www.fileformat.info/format/material/)

    float roughness;
    float metallic;

    bool use_specular_workflow;

    ChTexture kd_texture;         ///< diffuse texture map
    ChTexture ks_texture;         ///< specular texture map
    ChTexture normal_texture;     ///< normal texture map
    ChTexture metallic_texture;   ///< metallic texture map
    ChTexture roughness_texture;  ///< roughness texture map
    ChTexture opacity_texture;    ///< opacity texture map

    unsigned short int class_id;
    unsigned short int instance_id;
}